

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileiconengine.cpp
# Opt level: O0

QPixmap * __thiscall
QAbstractFileIconEngine::scaledPixmap
          (QAbstractFileIconEngine *this,QSize *size,Mode mode,State state,qreal scale)

{
  bool bVar1;
  int iVar2;
  uint in_ECX;
  QString *in_RDX;
  QPixmap *in_RSI;
  QPixmap *in_RDI;
  uint in_R8D;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  QPixmap *result;
  QString key;
  QPixmap *this_00;
  uint in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  QSize local_88;
  undefined1 local_80 [24];
  undefined1 local_68 [30];
  undefined2 local_4a;
  QSize local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar1 = QSize::isValid((QSize *)in_RSI);
  if (bVar1) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    (*(in_RSI->super_QPaintDevice)._vptr_QPaintDevice[0x11])(&local_20);
    bVar1 = QString::isEmpty((QString *)0x272fae);
    if (bVar1) {
      local_28 = ::operator*((QSize *)in_RSI,(qreal)this_00);
      (*(in_RSI->super_QPaintDevice)._vptr_QPaintDevice[0x10])
                (in_RDI,in_RSI,&local_28,(ulong)in_ECX,(ulong)in_R8D);
    }
    else {
      local_4a = 0x5f;
      iVar2 = QSize::width((QSize *)0x273011);
      QString::number((double)iVar2 * in_XMM0_Qa,(char)local_68,0x67);
      ::operator+((char16_t *)this_00,(QString *)in_RDI);
      ::operator+=(in_RDX,(QStringBuilder<char16_t,_QString> *)CONCAT44(in_ECX,in_R8D));
      QStringBuilder<char16_t,_QString>::~QStringBuilder
                ((QStringBuilder<char16_t,_QString> *)0x27306b);
      QString::~QString((QString *)0x273075);
      in_stack_ffffffffffffff48 = in_stack_ffffffffffffff48 & 0xffffff;
      (in_RDI->super_QPaintDevice)._vptr_QPaintDevice = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)&(in_RDI->super_QPaintDevice).painters = &DAT_aaaaaaaaaaaaaaaa;
      (in_RDI->data).d.ptr = (QPlatformPixmap *)&DAT_aaaaaaaaaaaaaaaa;
      QPixmap::QPixmap(in_RDI);
      bVar1 = QPixmapCache::find((QString *)this_00,in_RDI);
      if (!bVar1) {
        local_88 = ::operator*((QSize *)in_RSI,(qreal)this_00);
        (*(in_RSI->super_QPaintDevice)._vptr_QPaintDevice[0x10])
                  (local_80,in_RSI,&local_88,(ulong)in_ECX,(ulong)in_R8D);
        QPixmap::operator=(this_00,in_RDI);
        QPixmap::~QPixmap(in_RDI);
        bVar1 = QPixmap::isNull(in_RDI);
        if (!bVar1) {
          QPixmapCache::insert
                    ((QString *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),in_RSI
                    );
        }
      }
    }
    QString::~QString((QString *)0x273158);
  }
  else {
    QPixmap::QPixmap(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap QAbstractFileIconEngine::scaledPixmap(const QSize &size, QIcon::Mode mode, QIcon::State state, qreal scale)
{
    Q_UNUSED(mode);
    Q_UNUSED(state);

    if (!size.isValid())
        return QPixmap();

    QString key = cacheKey();
    if (key.isEmpty())
        return filePixmap(size * scale, mode, state);

    key += u'_' + QString::number(size.width() * scale);

    QPixmap result;
    if (!QPixmapCache::find(key, &result)) {
        result = filePixmap(size * scale, mode, state);
        if (!result.isNull())
            QPixmapCache::insert(key, result);
    }

    return result;
}